

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

int poly_unmarshal(poly *out,uint8_t *in)

{
  short sVar1;
  uint i;
  int iVar2;
  poly *ppVar3;
  size_t i_1;
  long lVar4;
  uint16_t *p;
  
  lVar4 = 0xc;
  ppVar3 = out;
  while( true ) {
    (ppVar3->field_0).v[0] = (in[lVar4 + -0xb] & 0x1f) << 8 | (ushort)in[lVar4 + -0xc];
    (ppVar3->field_0).v[1] =
         (in[lVar4 + -9] & 3) << 0xb | (ushort)(in[lVar4 + -0xb] >> 5) + (ushort)in[lVar4 + -10] * 8
    ;
    (ppVar3->field_0).v[2] = (in[lVar4 + -8] & 0x7f) << 6 | (ushort)(in[lVar4 + -9] >> 2);
    (ppVar3->field_0).v[3] =
         (in[lVar4 + -6] & 0xf) << 9 | (ushort)(in[lVar4 + -8] >> 7) + (ushort)in[lVar4 + -7] * 2;
    if (lVar4 == 0x477) break;
    (ppVar3->field_0).v[4] =
         (in[lVar4 + -4] & 1) << 0xc | (ushort)in[lVar4 + -5] << 4 | (ushort)(in[lVar4 + -6] >> 4);
    (ppVar3->field_0).v[5] = (in[lVar4 + -3] & 0x3f) << 7 | (ushort)(in[lVar4 + -4] >> 1);
    (ppVar3->field_0).v[6] =
         (in[lVar4 + -1] & 7) << 10 | (ushort)(in[lVar4 + -3] >> 6) + (ushort)in[lVar4 + -2] * 4;
    (ppVar3->field_0).v[7] = (ushort)in[lVar4] << 5 | (ushort)(in[lVar4 + -1] >> 3);
    ppVar3 = (poly *)((ppVar3->field_0).vectors + 1);
    lVar4 = lVar4 + 0xd;
  }
  for (lVar4 = 0; lVar4 != 700; lVar4 = lVar4 + 1) {
    (out->field_0).v[lVar4] = (uint16_t)((uint)(int)(short)((out->field_0).v[lVar4] << 3) >> 3);
  }
  iVar2 = 0;
  if (in[0x471] < 0x10) {
    sVar1 = 0;
    for (lVar4 = 0; lVar4 != 700; lVar4 = lVar4 + 1) {
      sVar1 = sVar1 + (out->field_0).v[lVar4];
    }
    (out->field_0).v[700] = -sVar1;
    *(undefined4 *)((long)&out->field_0 + 0x57a) = 0;
    (out->field_0).v[0x2bf] = 0;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int poly_unmarshal(struct poly *out, const uint8_t in[POLY_BYTES]) {
  uint16_t *p = out->v;

  for (size_t i = 0; i < N / 8; i++) {
    p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
    p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
           (uint16_t)(in[3] & 3) << 11;
    p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
    p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
           (uint16_t)(in[6] & 0xf) << 9;
    p[4] = (uint16_t)(in[6] >> 4) | (uint16_t)(in[7]) << 4 |
           (uint16_t)(in[8] & 1) << 12;
    p[5] = (uint16_t)(in[8] >> 1) | (uint16_t)(in[9] & 0x3f) << 7;
    p[6] = (uint16_t)(in[9] >> 6) | (uint16_t)(in[10]) << 2 |
           (uint16_t)(in[11] & 7) << 10;
    p[7] = (uint16_t)(in[11] >> 3) | (uint16_t)(in[12]) << 5;

    p += 8;
    in += 13;
  }

  // There are four coefficients remaining.
  p[0] = (uint16_t)(in[0]) | (uint16_t)(in[1] & 0x1f) << 8;
  p[1] = (uint16_t)(in[1] >> 5) | (uint16_t)(in[2]) << 3 |
         (uint16_t)(in[3] & 3) << 11;
  p[2] = (uint16_t)(in[3] >> 2) | (uint16_t)(in[4] & 0x7f) << 6;
  p[3] = (uint16_t)(in[4] >> 7) | (uint16_t)(in[5]) << 1 |
         (uint16_t)(in[6] & 0xf) << 9;

  for (unsigned i = 0; i < N - 1; i++) {
    out->v[i] = (int16_t)(out->v[i] << 3) >> 3;
  }

  // There are four unused bits in the last byte. We require them to be zero.
  if ((in[6] & 0xf0) != 0) {
    return 0;
  }

  // Set the final coefficient as specifed in [HRSSNIST] 1.9.2 step 6.
  uint32_t sum = 0;
  for (size_t i = 0; i < N - 1; i++) {
    sum += out->v[i];
  }

  out->v[N - 1] = (uint16_t)(0u - sum);
  poly_normalize(out);

  return 1;
}